

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

uint16_t * __thiscall
capnp::SchemaLoader::Validator::makeMemberInfoArray(Validator *this,uint32_t *count)

{
  uint uVar1;
  bool bVar2;
  size_t sVar3;
  unsigned_short *puVar4;
  ulong index;
  Fault local_b8;
  Fault f;
  undefined1 local_a8 [8];
  DebugComparison<unsigned_int_&,_unsigned_int_&> _kjCondition;
  Entry *member;
  Iterator __end2;
  Iterator __begin2;
  TreeMap<capnp::Text::Reader,_unsigned_int> *__range2;
  undefined1 auStack_28 [4];
  uint pos;
  ArrayPtr<unsigned_short> result;
  uint32_t *count_local;
  Validator *this_local;
  
  result.size_ = (size_t)count;
  sVar3 = kj::TreeMap<capnp::Text::Reader,_unsigned_int>::size(&this->members);
  *(int *)result.size_ = (int)sVar3;
  _auStack_28 = kj::Arena::allocateArray<unsigned_short>
                          (&this->loader->arena,(ulong)*(uint *)result.size_);
  __range2._4_4_ = 0;
  kj::TreeMap<capnp::Text::Reader,_unsigned_int>::begin
            ((Iterator *)&__end2.inner.row,&this->members);
  kj::TreeMap<capnp::Text::Reader,_unsigned_int>::end((Iterator *)&member,&this->members);
  while( true ) {
    bVar2 = kj::
            MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>_>
            ::operator==((MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>_>
                          *)&__end2.inner.row,
                         (MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>_>
                          *)&member);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    _kjCondition._32_8_ =
         kj::
         MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>_>
         ::operator*((MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>_>
                      *)&__end2.inner.row);
    uVar1 = ((Entry *)_kjCondition._32_8_)->value;
    index = (ulong)__range2._4_4_;
    __range2._4_4_ = __range2._4_4_ + 1;
    puVar4 = kj::ArrayPtr<unsigned_short>::operator[]((ArrayPtr<unsigned_short> *)auStack_28,index);
    *puVar4 = (unsigned_short)uVar1;
    kj::
    MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>_>
    ::operator++((MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>_>
                  *)&__end2.inner.row);
  }
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (uint *)((long)&__range2 + 4));
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_unsigned_int_&> *)local_a8,
             (DebugExpression<unsigned_int&> *)&f,(uint *)result.size_);
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a8);
  if (!bVar2) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int&>&>
              (&local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x115,FAILED,"pos == *count","_kjCondition,",
               (DebugComparison<unsigned_int_&,_unsigned_int_&> *)local_a8);
    kj::_::Debug::Fault::fatal(&local_b8);
  }
  puVar4 = kj::ArrayPtr<unsigned_short>::begin((ArrayPtr<unsigned_short> *)auStack_28);
  return puVar4;
}

Assistant:

const uint16_t* makeMemberInfoArray(uint32_t* count) {
    *count = members.size();
    kj::ArrayPtr<uint16_t> result = loader.arena.allocateArray<uint16_t>(*count);
    uint pos = 0;
    for (auto& member: members) {
      result[pos++] = member.value;
    }
    KJ_DASSERT(pos == *count);
    return result.begin();
  }